

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::allocate
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this)

{
  char cVar1;
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this_00;
  value_type *__x;
  long in_RDI;
  Task *p;
  Task *q;
  Task *h;
  char *endptr;
  char *baseptr;
  memory_order __b;
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *last_datain;
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *datain;
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *local_30;
  
  this_00 = (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
            PoolAllocator_malloc_free<false>::malloc
                      ((long)(*(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x1c)));
  datain = (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
           ((((function<void_()> *)&this_00->v_)->super__Function_base)._M_functor._M_pod_data +
           *(int *)(in_RDI + 0x1c) * (*(int *)(in_RDI + 0x18) + -1));
  last_datain = this_00;
  local_30 = this_00;
  do {
    local_30 = (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
               ((((function<void_()> *)&local_30->v_)->super__Function_base)._M_functor._M_pod_data
               + *(int *)(in_RDI + 0x1c));
    *(LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> **)&last_datain->pool_mutex_
         = local_30;
    last_datain = *(LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> **)
                   &last_datain->pool_mutex_;
  } while (local_30 <= datain);
  do {
    __x = (value_type *)(in_RDI + 0x28);
    LOCK();
    cVar1 = *(char *)__x;
    *(undefined1 *)__x = 1;
    UNLOCK();
  } while (cVar1 != '\0');
  std::
  vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
  ::push_back((vector<depspawn::internal::TaskPool::Task_*,_std::allocator<depspawn::internal::TaskPool::Task_*>_>
               *)0x1,__x);
  freeLinkedList(this_00,(Task *)datain,(Task *)last_datain,SUB81((ulong)in_RDI >> 0x38,0));
  std::operator&(memory_order_release,__memory_order_mask);
  *(undefined1 *)(in_RDI + 0x28) = 0;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }